

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

Function * __thiscall
backend::codegen::Codegen::translate_function(Function *__return_storage_ptr__,Codegen *this)

{
  string *file;
  pointer puVar1;
  Codegen *pCVar2;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::any>,std::_Select1st<std::pair<std::__cxx11::string_const,std::any>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>
  *this_00;
  MirFunction *pMVar3;
  Function *this_01;
  ConditionCode CVar4;
  unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *i;
  mapped_type *blk;
  iterator iVar5;
  ostream *poVar6;
  iterator iVar7;
  pointer puVar8;
  _Rb_tree_node_base *p_Var9;
  iterator iVar10;
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::map<mir::inst::VarId,unsigned_int,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,unsigned_int>>>>,std::allocator<std::pair<std::__cxx11::string_const,std::map<mir::inst::VarId,unsigned_int,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,unsigned_int>>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  *p_Var11;
  pointer puVar12;
  unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *i_1;
  Codegen *pCVar13;
  char *pcVar14;
  Tag *pTVar15;
  Function *pFVar16;
  bool bVar17;
  bool bVar18;
  allocator<char> local_1a3;
  allocator<char> local_1a2;
  allocator<char> local_1a1;
  uint bb_id;
  uint next_bb;
  undefined **local_198;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
  *local_190;
  undefined1 local_188;
  undefined1 local_180 [32];
  string local_160;
  undefined8 local_140;
  Tag local_138;
  vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  local_108;
  Codegen *local_f0;
  map<unsigned_int,_arm::ConditionCode,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_arm::ConditionCode>_>_>
  *local_e8;
  undefined1 local_e0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_c8;
  _Alloc_hider local_b8;
  __node_base a_Stack_b0 [5];
  vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  *__range5;
  Function *local_80;
  _Base_ptr local_78;
  __shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2> local_70;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> vis;
  
  pcVar14 = (char *)this;
  local_80 = __return_storage_ptr__;
  init_reg_map(this);
  scan_stack(this);
  scan(this);
  generate_startup(this);
  local_108.
  super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (this->inst).
       super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_108.
  super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (this->inst).
       super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_108.
  super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->inst).
       super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->inst).
  super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->inst).
  super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->inst).
  super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vis._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &vis._M_t._M_impl.super__Rb_tree_header._M_header;
  vis._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  vis._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  __range5 = &this->inst;
  vis._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  puVar12 = (this->bb_ordering).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start;
  local_e8 = &this->inline_hint;
  local_78 = &(this->inline_hint)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_f0 = this;
  vis._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       vis._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if (puVar12 ==
        (this->bb_ordering).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::
      vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
      ::clear(__range5);
      generate_return_and_cleanup(this);
      pCVar2 = (Codegen *)
               (this->inst).
               super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pCVar13 = (Codegen *)
                     (this->inst).
                     super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pCVar13 != pCVar2;
          pCVar13 = (Codegen *)&pCVar13->package) {
        pcVar14 = (char *)pCVar13;
        std::
        vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
        ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
                  ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
                    *)&local_108,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)pCVar13);
      }
      bb_id = bb_id & 0xffffff00;
      AixLog::operator<<((ostream *)&bb_id,(Severity *)pcVar14);
      AixLog::Tag::Tag(&local_138);
      AixLog::operator<<((ostream *)&local_138,(Tag *)pcVar14);
      local_190 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                   *)std::chrono::_V2::system_clock::now();
      local_198 = &PTR__Timestamp_001d8f28;
      local_188 = 0;
      AixLog::operator<<((ostream *)&local_198,(Timestamp *)pcVar14);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_180,"translate_function",(allocator<char> *)&next_bb);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(local_180 + 0x20),
                 "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/codegen.cpp"
                 ,&local_1a3);
      pFVar16 = (Function *)local_180;
      AixLog::Function::Function
                ((Function *)local_e0,(string *)pFVar16,(string *)(local_180 + 0x20),0x8c);
      AixLog::operator<<((ostream *)local_e0,pFVar16);
      pcVar14 = "VariableToReg: ";
      poVar6 = std::operator<<((ostream *)&std::clog,"VariableToReg: ");
      std::endl<char,std::char_traits<char>>(poVar6);
      AixLog::Function::~Function((Function *)local_e0);
      file = (string *)(local_180 + 0x20);
      std::__cxx11::string::~string((string *)file);
      std::__cxx11::string::~string((string *)local_180);
      AixLog::Tag::~Tag(&local_138);
      local_e8 = (map<unsigned_int,_arm::ConditionCode,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_arm::ConditionCode>_>_>
                  *)&local_f0->reg_map;
      local_140 = &(local_f0->reg_map)._M_t._M_impl.super__Rb_tree_header;
      for (p_Var9 = (local_f0->reg_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          p_Var9 != (_Rb_tree_node_base *)local_140;
          p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
        bb_id = (uint)bb_id._1_3_ << 8;
        AixLog::operator<<((ostream *)&bb_id,(Severity *)pcVar14);
        AixLog::Tag::Tag(&local_138);
        AixLog::operator<<((ostream *)&local_138,(Tag *)pcVar14);
        local_190 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                     *)std::chrono::_V2::system_clock::now();
        local_198 = &PTR__Timestamp_001d8f28;
        local_188 = 0;
        AixLog::operator<<((ostream *)&local_198,(Timestamp *)pcVar14);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_180,"translate_function",(allocator<char> *)&next_bb);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)file,
                   "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/codegen.cpp"
                   ,&local_1a3);
        pFVar16 = (Function *)local_180;
        AixLog::Function::Function((Function *)local_e0,(string *)local_180,file,0x8e);
        AixLog::operator<<((ostream *)local_e0,pFVar16);
        (*(code *)**(undefined8 **)(p_Var9 + 1))(p_Var9 + 1,&std::clog);
        pTVar15 = (Tag *)0x194f9f;
        std::operator<<((ostream *)&std::clog," -> ");
        AixLog::Function::~Function((Function *)local_e0);
        std::__cxx11::string::~string((string *)file);
        std::__cxx11::string::~string((string *)local_180);
        AixLog::Tag::~Tag(&local_138);
        bb_id = bb_id & 0xffffff00;
        AixLog::operator<<((ostream *)&bb_id,(Severity *)pTVar15);
        AixLog::Tag::Tag(&local_138);
        AixLog::operator<<((ostream *)&local_138,pTVar15);
        local_190 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                     *)std::chrono::_V2::system_clock::now();
        local_198 = &PTR__Timestamp_001d8f28;
        local_188 = 0;
        AixLog::operator<<((ostream *)&local_198,(Timestamp *)pTVar15);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_180,"translate_function",(allocator<char> *)&next_bb);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)file,
                   "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/codegen.cpp"
                   ,&local_1a3);
        pFVar16 = (Function *)local_180;
        AixLog::Function::Function((Function *)local_e0,(string *)local_180,file,0x8f);
        AixLog::operator<<((ostream *)local_e0,pFVar16);
        pTVar15 = (Tag *)(ulong)*(uint *)&p_Var9[1]._M_left;
        arm::display_reg_name((ostream *)&std::clog,*(uint *)&p_Var9[1]._M_left);
        AixLog::Function::~Function((Function *)local_e0);
        std::__cxx11::string::~string((string *)file);
        std::__cxx11::string::~string((string *)local_180);
        AixLog::Tag::~Tag(&local_138);
        bb_id = bb_id & 0xffffff00;
        AixLog::operator<<((ostream *)&bb_id,(Severity *)pTVar15);
        AixLog::Tag::Tag(&local_138);
        AixLog::operator<<((ostream *)&local_138,pTVar15);
        local_190 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                     *)std::chrono::_V2::system_clock::now();
        local_198 = &PTR__Timestamp_001d8f28;
        local_188 = 0;
        AixLog::operator<<((ostream *)&local_198,(Timestamp *)pTVar15);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_180,"translate_function",(allocator<char> *)&next_bb);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)file,
                   "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/codegen.cpp"
                   ,&local_1a3);
        pcVar14 = (char *)local_180;
        AixLog::Function::Function((Function *)local_e0,(string *)local_180,file,0x90);
        AixLog::operator<<((ostream *)local_e0,(Function *)pcVar14);
        std::endl<char,std::char_traits<char>>((ostream *)&std::clog);
        AixLog::Function::~Function((Function *)local_e0);
        std::__cxx11::string::~string((string *)file);
        std::__cxx11::string::~string((string *)local_180);
        AixLog::Tag::~Tag(&local_138);
      }
      bb_id = (uint)bb_id._1_3_ << 8;
      AixLog::operator<<((ostream *)&bb_id,(Severity *)pcVar14);
      AixLog::Tag::Tag(&local_138);
      this_01 = local_80;
      pCVar13 = local_f0;
      AixLog::operator<<((ostream *)&local_138,(Tag *)pcVar14);
      local_190 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                   *)std::chrono::_V2::system_clock::now();
      local_198 = &PTR__Timestamp_001d8f28;
      local_188 = 0;
      AixLog::operator<<((ostream *)&local_198,(Timestamp *)pcVar14);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_180,"translate_function",(allocator<char> *)&next_bb);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(local_180 + 0x20),
                 "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/codegen.cpp"
                 ,&local_1a3);
      pFVar16 = (Function *)local_180;
      AixLog::Function::Function
                ((Function *)local_e0,(string *)pFVar16,(string *)(local_180 + 0x20),0x92);
      AixLog::operator<<((ostream *)local_e0,pFVar16);
      std::endl<char,std::char_traits<char>>((ostream *)&std::clog);
      AixLog::Function::~Function((Function *)local_e0);
      std::__cxx11::string::~string((string *)(local_180 + 0x20));
      std::__cxx11::string::~string((string *)local_180);
      AixLog::Tag::~Tag(&local_138);
      iVar10 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
               ::find(&pCVar13->extra_data->_M_t,
                      (key_type *)::optimization::MIR_VARIABLE_TO_ARM_VREG_DATA_NAME_abi_cxx11_);
      this_00 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::any>,std::_Select1st<std::pair<std::__cxx11::string_const,std::any>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>
                 *)pCVar13->extra_data;
      if (iVar10._M_node == (_Base_ptr)(this_00 + 8)) {
        local_e0._0_8_ = a_Stack_b0;
        local_e0._8_8_ = (__buckets_ptr)0x1;
        local_e0._16_8_ = (_Hash_node_base *)0x0;
        aStack_c8._M_allocated_capacity = 0;
        aStack_c8._8_8_ = 0x3f800000;
        local_b8._M_p = (pointer)0x0;
        a_Stack_b0[0]._M_nxt = (_Hash_node_base *)0x0;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
        ::
        pair<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<mir::inst::VarId,_unsigned_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_unsigned_int>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<mir::inst::VarId,_unsigned_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_unsigned_int>_>_>_>_>_>,_true>
                  ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
                    *)&local_138,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ::optimization::MIR_VARIABLE_TO_ARM_VREG_DATA_NAME_abi_cxx11_,
                   (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<mir::inst::VarId,_unsigned_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_unsigned_int>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<mir::inst::VarId,_unsigned_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_unsigned_int>_>_>_>_>_>
                    *)local_e0);
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::any>,std::_Select1st<std::pair<std::__cxx11::string_const,std::any>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>
        ::_M_insert_unique<std::pair<std::__cxx11::string_const,std::any>>
                  (this_00,(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
                            *)&local_138);
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
        ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
                 *)&local_138);
        std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<mir::inst::VarId,_unsigned_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_unsigned_int>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<mir::inst::VarId,_unsigned_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_unsigned_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<mir::inst::VarId,_unsigned_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_unsigned_int>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<mir::inst::VarId,_unsigned_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_unsigned_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)local_e0);
        iVar10 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                 ::find(&pCVar13->extra_data->_M_t,
                        (key_type *)::optimization::MIR_VARIABLE_TO_ARM_VREG_DATA_NAME_abi_cxx11_);
      }
      p_Var11 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::map<mir::inst::VarId,unsigned_int,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,unsigned_int>>>>,std::allocator<std::pair<std::__cxx11::string_const,std::map<mir::inst::VarId,unsigned_int,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,unsigned_int>>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                 *)std::
                   any_cast<std::unordered_map<std::__cxx11::string,std::map<mir::inst::VarId,unsigned_int,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,unsigned_int>>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::map<mir::inst::VarId,unsigned_int,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,unsigned_int>>>>>>&>
                             ((any *)(iVar10._M_node + 2));
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<mir::inst::VarId,_unsigned_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_unsigned_int>_>_>_>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::map<mir::inst::VarId,_unsigned_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_unsigned_int>_>_>,_true>
                ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<mir::inst::VarId,_unsigned_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_unsigned_int>_>_>_>
                  *)local_e0,&pCVar13->func->name,
                 (map<mir::inst::VarId,_unsigned_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_unsigned_int>_>_>
                  *)local_e8);
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::map<mir::inst::VarId,unsigned_int,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,unsigned_int>>>>,std::allocator<std::pair<std::__cxx11::string_const,std::map<mir::inst::VarId,unsigned_int,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,unsigned_int>>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::
      _M_emplace<std::pair<std::__cxx11::string_const,std::map<mir::inst::VarId,unsigned_int,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,unsigned_int>>>>>
                (p_Var11,local_e0);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<mir::inst::VarId,_unsigned_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_unsigned_int>_>_>_>
      ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<mir::inst::VarId,_unsigned_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_unsigned_int>_>_>_>
               *)local_e0);
      pMVar3 = pCVar13->func;
      std::__shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_70,
                 &(pMVar3->type).
                  super___shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>);
      arm::Function::Function
                (this_01,&pMVar3->name,(shared_ptr<mir::types::FunctionTy> *)&local_70,&local_108,
                 &pCVar13->consts,pCVar13->stack_size);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree(&vis._M_t);
      std::
      vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
      ::~vector(&local_108);
      return this_01;
    }
    bb_id = *puVar12;
    local_140 = puVar12;
    std::
    vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
    ::clear(__range5);
    local_e0._0_4_ = bb_id;
    blk = std::
          map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
          ::at(&this->func->basic_blks,(key_type *)local_e0);
    std::
    _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
    ::_M_insert_unique<unsigned_int_const&>
              ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                *)&vis,&bb_id);
    translate_basic_block(this,blk);
    (this->second_last_condition_code).super__Optional_base<arm::ConditionCode,_true,_true>.
    _M_payload.super__Optional_payload_base<arm::ConditionCode> =
         (_Optional_payload_base<arm::ConditionCode>)0x0;
    pcVar14 = (char *)&bb_id;
    iVar5 = std::
            _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_arm::ConditionCode>,_std::_Select1st<std::pair<const_unsigned_int,_arm::ConditionCode>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_arm::ConditionCode>_>_>
            ::find(&local_e8->_M_t,(key_type_conflict *)pcVar14);
    if ((iVar5._M_node != local_78 & this->enable_cond_exec) == 1) {
      next_bb = next_bb & 0xffffff00;
      AixLog::operator<<((ostream *)&next_bb,(Severity *)pcVar14);
      AixLog::Tag::Tag(&local_138);
      AixLog::operator<<((ostream *)&local_138,(Tag *)pcVar14);
      local_190 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                   *)std::chrono::_V2::system_clock::now();
      local_198 = &PTR__Timestamp_001d8f28;
      local_188 = 0;
      AixLog::operator<<((ostream *)&local_198,(Timestamp *)pcVar14);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_180,"translate_function",&local_1a3);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(local_180 + 0x20),
                 "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/codegen.cpp"
                 ,&local_1a2);
      pFVar16 = (Function *)local_180;
      AixLog::Function::Function
                ((Function *)local_e0,(string *)pFVar16,(string *)(local_180 + 0x20),0x27);
      AixLog::operator<<((ostream *)local_e0,pFVar16);
      poVar6 = std::operator<<((ostream *)&std::clog,"Found inline hint for ");
      pcVar14 = (char *)(ulong)bb_id;
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      std::endl<char,std::char_traits<char>>(poVar6);
      AixLog::Function::~Function((Function *)local_e0);
      std::__cxx11::string::~string((string *)(local_180 + 0x20));
      std::__cxx11::string::~string((string *)local_180);
      AixLog::Tag::~Tag(&local_138);
      if ((this->last_jump).super__Optional_base<backend::codegen::LastJump,_true,_true>._M_payload.
          super__Optional_payload_base<backend::codegen::LastJump>._M_engaged == true) {
        bVar17 = bb_id != (this->last_jump).
                          super__Optional_base<backend::codegen::LastJump,_true,_true>._M_payload.
                          super__Optional_payload_base<backend::codegen::LastJump>._M_payload.
                          _M_value.bb_true;
        bVar18 = bb_id != (this->last_jump).
                          super__Optional_base<backend::codegen::LastJump,_true,_true>._M_payload.
                          super__Optional_payload_base<backend::codegen::LastJump>._M_payload.
                          _M_value.bb_false;
        if (bVar18 && bVar17) {
          next_bb = next_bb & 0xffffff00;
          AixLog::operator<<((ostream *)&next_bb,(Severity *)pcVar14);
          AixLog::Tag::Tag(&local_138);
          AixLog::operator<<((ostream *)&local_138,(Tag *)pcVar14);
          local_190 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                       *)std::chrono::_V2::system_clock::now();
          local_198 = &PTR__Timestamp_001d8f28;
          local_188 = 0;
          AixLog::operator<<((ostream *)&local_198,(Timestamp *)pcVar14);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_180,"translate_function",&local_1a3);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)(local_180 + 0x20),
                     "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/codegen.cpp"
                     ,&local_1a2);
          pFVar16 = (Function *)local_180;
          AixLog::Function::Function
                    ((Function *)local_e0,(string *)pFVar16,(string *)(local_180 + 0x20),0x35);
          AixLog::operator<<((ostream *)local_e0,pFVar16);
          pcVar14 = "Inline ruined by not next to source basic block";
          poVar6 = std::operator<<((ostream *)&std::clog,
                                   "Inline ruined by not next to source basic block");
          std::endl<char,std::char_traits<char>>(poVar6);
          AixLog::Function::~Function((Function *)local_e0);
          std::__cxx11::string::~string((string *)(local_180 + 0x20));
          std::__cxx11::string::~string((string *)local_180);
          AixLog::Tag::~Tag(&local_138);
        }
        next_bb = *(pointer)(local_140 + 4);
        if ((blk->jump).kind == BrCond) {
          pcVar14 = (char *)&next_bb;
          iVar7 = std::
                  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_arm::ConditionCode>,_std::_Select1st<std::pair<const_unsigned_int,_arm::ConditionCode>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_arm::ConditionCode>_>_>
                  ::find(&local_e8->_M_t,(key_type_conflict *)pcVar14);
          if (iVar5._M_node[1].field_0x4 != iVar7._M_node[1].field_0x4) {
            local_1a3 = (allocator<char>)0x0;
            AixLog::operator<<((ostream *)&local_1a3,(Severity *)pcVar14);
            AixLog::Tag::Tag(&local_138);
            this = local_f0;
            AixLog::operator<<((ostream *)&local_138,(Tag *)pcVar14);
            local_190 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                         *)std::chrono::_V2::system_clock::now();
            local_198 = &PTR__Timestamp_001d8f28;
            local_188 = 0;
            AixLog::operator<<((ostream *)&local_198,(Timestamp *)pcVar14);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_180,"translate_function",&local_1a2);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)(local_180 + 0x20),
                       "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/codegen.cpp"
                       ,&local_1a1);
            pFVar16 = (Function *)local_180;
            AixLog::Function::Function
                      ((Function *)local_e0,(string *)pFVar16,(string *)(local_180 + 0x20),0x3d);
            AixLog::operator<<((ostream *)local_e0,pFVar16);
            pcVar14 = "Inline ruined by hint not matching (this: ";
            std::operator<<((ostream *)&std::clog,"Inline ruined by hint not matching (this: ");
            AixLog::Function::~Function((Function *)local_e0);
            std::__cxx11::string::~string((string *)(local_180 + 0x20));
            std::__cxx11::string::~string((string *)local_180);
            AixLog::Tag::~Tag(&local_138);
            CVar4 = iVar5._M_node[1].field_0x4;
            local_1a3 = (allocator<char>)0x0;
            AixLog::operator<<((ostream *)&local_1a3,(Severity *)pcVar14);
            AixLog::Tag::Tag(&local_138);
            AixLog::operator<<((ostream *)&local_138,(Tag *)pcVar14);
            local_190 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                         *)std::chrono::_V2::system_clock::now();
            local_198 = &PTR__Timestamp_001d8f28;
            local_188 = 0;
            AixLog::operator<<((ostream *)&local_198,(Timestamp *)pcVar14);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_180,"translate_function",&local_1a2);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)(local_180 + 0x20),
                       "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/codegen.cpp"
                       ,&local_1a1);
            pFVar16 = (Function *)local_180;
            AixLog::Function::Function
                      ((Function *)local_e0,(string *)pFVar16,(string *)(local_180 + 0x20),0x3e);
            AixLog::operator<<((ostream *)local_e0,pFVar16);
            pTVar15 = (Tag *)&std::clog;
            arm::display_cond(CVar4,(ostream *)&std::clog);
            AixLog::Function::~Function((Function *)local_e0);
            std::__cxx11::string::~string((string *)(local_180 + 0x20));
            std::__cxx11::string::~string((string *)local_180);
            AixLog::Tag::~Tag(&local_138);
            local_1a3 = (allocator<char>)0x0;
            AixLog::operator<<((ostream *)&local_1a3,(Severity *)pTVar15);
            AixLog::Tag::Tag(&local_138);
            AixLog::operator<<((ostream *)&local_138,pTVar15);
            local_190 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                         *)std::chrono::_V2::system_clock::now();
            local_198 = &PTR__Timestamp_001d8f28;
            local_188 = 0;
            AixLog::operator<<((ostream *)&local_198,(Timestamp *)pTVar15);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_180,"translate_function",&local_1a2);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)(local_180 + 0x20),
                       "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/codegen.cpp"
                       ,&local_1a1);
            pFVar16 = (Function *)local_180;
            AixLog::Function::Function
                      ((Function *)local_e0,(string *)pFVar16,(string *)(local_180 + 0x20),0x3f);
            AixLog::operator<<((ostream *)local_e0,pFVar16);
            pcVar14 = ", next: ";
            std::operator<<((ostream *)&std::clog,", next: ");
            AixLog::Function::~Function((Function *)local_e0);
            std::__cxx11::string::~string((string *)(local_180 + 0x20));
            std::__cxx11::string::~string((string *)local_180);
            AixLog::Tag::~Tag(&local_138);
            CVar4 = iVar7._M_node[1].field_0x4;
            local_1a3 = (allocator<char>)0x0;
            AixLog::operator<<((ostream *)&local_1a3,(Severity *)pcVar14);
            AixLog::Tag::Tag(&local_138);
            AixLog::operator<<((ostream *)&local_138,(Tag *)pcVar14);
            local_190 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                         *)std::chrono::_V2::system_clock::now();
            local_198 = &PTR__Timestamp_001d8f28;
            local_188 = 0;
            AixLog::operator<<((ostream *)&local_198,(Timestamp *)pcVar14);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_180,"translate_function",&local_1a2);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)(local_180 + 0x20),
                       "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/codegen.cpp"
                       ,&local_1a1);
            pFVar16 = (Function *)local_180;
            AixLog::Function::Function
                      ((Function *)local_e0,(string *)pFVar16,(string *)(local_180 + 0x20),0x40);
            AixLog::operator<<((ostream *)local_e0,pFVar16);
            pTVar15 = (Tag *)&std::clog;
            arm::display_cond(CVar4,(ostream *)&std::clog);
            AixLog::Function::~Function((Function *)local_e0);
            std::__cxx11::string::~string((string *)(local_180 + 0x20));
            std::__cxx11::string::~string((string *)local_180);
            AixLog::Tag::~Tag(&local_138);
            local_1a3 = (allocator<char>)0x0;
            AixLog::operator<<((ostream *)&local_1a3,(Severity *)pTVar15);
            AixLog::Tag::Tag(&local_138);
            AixLog::operator<<((ostream *)&local_138,pTVar15);
            local_190 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                         *)std::chrono::_V2::system_clock::now();
            local_198 = &PTR__Timestamp_001d8f28;
            local_188 = 0;
            AixLog::operator<<((ostream *)&local_198,(Timestamp *)pTVar15);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_180,"translate_function",&local_1a2);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)(local_180 + 0x20),
                       "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/codegen.cpp"
                       ,&local_1a1);
            pcVar14 = local_180;
            AixLog::Function::Function
                      ((Function *)local_e0,(string *)pcVar14,(string *)(local_180 + 0x20),0x41);
            AixLog::operator<<((ostream *)local_e0,(Function *)pcVar14);
            std::endl<char,std::char_traits<char>>((ostream *)&std::clog);
            AixLog::Function::~Function((Function *)local_e0);
            std::__cxx11::string::~string((string *)(local_180 + 0x20));
            std::__cxx11::string::~string((string *)local_180);
            AixLog::Tag::~Tag(&local_138);
            goto LAB_00151022;
          }
        }
        this = local_f0;
        if (!bVar18 || !bVar17) {
          puVar12 = (pointer)(local_140 + 4);
          CVar4 = (local_f0->last_jump).super__Optional_base<backend::codegen::LastJump,_true,_true>
                  ._M_payload.super__Optional_payload_base<backend::codegen::LastJump>._M_payload.
                  _M_value.cond;
          if (bb_id == (local_f0->last_jump).
                       super__Optional_base<backend::codegen::LastJump,_true,_true>._M_payload.
                       super__Optional_payload_base<backend::codegen::LastJump>._M_payload._M_value.
                       bb_true) {
            if ((puVar12 !=
                 (local_f0->bb_ordering).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish) &&
               (*puVar12 ==
                (local_f0->last_jump).super__Optional_base<backend::codegen::LastJump,_true,_true>.
                _M_payload.super__Optional_payload_base<backend::codegen::LastJump>._M_payload.
                _M_value.bb_false)) {
LAB_00150f9b:
              local_108.
              super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   local_108.
                   super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + -1;
              std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>::~unique_ptr
                        (local_108.
                         super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
              local_108.
              super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   local_108.
                   super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + -1;
              std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>::~unique_ptr
                        (local_108.
                         super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
            }
          }
          else {
            CVar4 = arm::invert_cond(CVar4);
            if ((puVar12 !=
                 (this->bb_ordering).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                 ._M_impl.super__Vector_impl_data._M_finish) &&
               (*puVar12 ==
                (this->last_jump).super__Optional_base<backend::codegen::LastJump,_true,_true>.
                _M_payload.super__Optional_payload_base<backend::codegen::LastJump>._M_payload.
                _M_value.bb_true)) goto LAB_00150f9b;
            pcVar14 = (char *)(local_108.
                               super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish + -2);
            std::
            vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
            ::erase(&local_108,(const_iterator)pcVar14);
            ((((__uniq_ptr_data<arm::Inst,_std::default_delete<arm::Inst>,_true,_true> *)
              &((_Hash_node_base *)
               (local_108.
                super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish + -1))->_M_nxt)->
             super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>)._M_t.
             super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
             super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl)->cond =
                 (this->last_jump).super__Optional_base<backend::codegen::LastJump,_true,_true>.
                 _M_payload.super__Optional_payload_base<backend::codegen::LastJump>._M_payload.
                 _M_value.cond;
          }
          puVar1 = (this->inst).
                   super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (puVar8 = (this->inst).
                        super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start; puVar8 != puVar1;
              puVar8 = puVar8 + 1) {
            ((puVar8->_M_t).super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>._M_t.
             super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
             super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl)->cond = CVar4;
          }
          (this->second_last_condition_code).super__Optional_base<arm::ConditionCode,_true,_true>.
          _M_payload.super__Optional_payload_base<arm::ConditionCode> =
               (_Optional_payload_base<arm::ConditionCode>)(CVar4 | 0x100);
        }
      }
    }
LAB_00151022:
    pCVar2 = (Codegen *)
             (this->inst).
             super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pCVar13 = (Codegen *)
                   (this->inst).
                   super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pCVar13 != pCVar2;
        pCVar13 = (Codegen *)&pCVar13->package) {
      pcVar14 = (char *)pCVar13;
      std::
      vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
      ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
                ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
                  *)&local_108,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)pCVar13);
    }
    puVar12 = (pointer)(local_140 + 4);
  } while( true );
}

Assistant:

arm::Function Codegen::translate_function() {
  init_reg_map();
  scan_stack();
  scan();
  generate_startup();
  std::vector<std::unique_ptr<arm::Inst>> inst_sink = std::move(inst);
  std::set<uint32_t> vis;
  for (auto it = bb_ordering.begin(); it != bb_ordering.end(); it++) {
    auto bb_id = *it;
    inst.clear();
    auto& bb = func.basic_blks.at(bb_id);
    vis.insert(bb_id);
    translate_basic_block(bb);

    std::optional<arm::ConditionCode> second_last_cond =
        std::move(second_last_condition_code);
    second_last_condition_code = {};
    if (auto hint = inline_hint.find(bb_id);
        enable_cond_exec && hint != inline_hint.end()) {
      LOG(TRACE) << "Found inline hint for " << bb_id << std::endl;
      bool can_inline = last_jump.has_value();

      if (can_inline) {
        // for (auto& i : inst) {
        //   if (i->cond != arm::ConditionCode::Always) {
        //     can_inline = false;
        //     LOG(TRACE) << "Inline ruined by a conditional execution"
        //                << std::endl;
        //     break;
        //   }
        // }
        if (bb_id != last_jump->bb_true && bb_id != last_jump->bb_false) {
          can_inline = false;
          LOG(TRACE) << "Inline ruined by not next to source basic block"
                     << std::endl;
        }
        auto next_bb = *(it + 1);
        if (bb.jump.kind == mir::inst::JumpInstructionKind::BrCond) {
          if (auto next_hint = inline_hint.find(next_bb);
              hint != inline_hint.end() && hint->second != next_hint->second) {
            can_inline = false;
            LOG(TRACE) << "Inline ruined by hint not matching (this: ";
            display_cond(hint->second, LOG(TRACE));
            LOG(TRACE) << ", next: ";
            display_cond(next_hint->second, LOG(TRACE));
            LOG(TRACE) << std::endl;
          }
          // if (vis.find(bb.jump.bb_true) != vis.end() ||
          //     vis.find(bb.jump.bb_false) != vis.end()) {
          //   can_inline = false;
          //   LOG(TRACE)
          //       << "Inline ruined by finding successor block in visited set"
          //       << std::endl;
          // }
        }

        // else if (second_last_cond &&
        //            ((bb_id == last_jump->bb_true &&
        //              (*second_last_cond) != last_jump->cond) ||
        //             (bb_id == last_jump->bb_false &&
        //              (*second_last_cond) != invert_cond(last_jump->cond))))
        //              {
        //   can_inline = false;
        //   LOG(TRACE) << "Inline ruined by second last condition: ";
        //   display_cond(*second_last_cond, LOG(TRACE));
        //   LOG(TRACE) << " which conflicts with current one: ";
        //   display_cond(last_jump->cond, LOG(TRACE));
        //   LOG(TRACE) << std::endl;
        // }
      }
      if (can_inline) {
        // Calculate condition code to be used in this block
        ConditionCode cond;
        mir::types::LabelId expected_bb;
        bool inverted;
        if (bb_id == last_jump->bb_true) {
          cond = last_jump->cond;
          expected_bb = last_jump->bb_false;
          inverted = false;
          if (it + 1 != bb_ordering.end() && *(it + 1) == last_jump->bb_false) {
            inst_sink.pop_back();
            inst_sink.pop_back();
          } else {
          }
        } else {
          cond = invert_cond(last_jump->cond);
          expected_bb = last_jump->bb_true;
          inverted = true;
          // since a conditional branch is always emitted in the fashion of
          // "bb_false, bb_true", we can safely pop the second-to-last branch
          // operation and add the condition to bb_true
          if (it + 1 != bb_ordering.end() && *(it + 1) == last_jump->bb_true) {
            inst_sink.pop_back();
            inst_sink.pop_back();
          } else {
            inst_sink.erase(inst_sink.end() - 2);
            inst_sink.back()->cond = last_jump->cond;
          }
        }

        for (auto& i : inst) {
          i->cond = cond;
        }

        second_last_condition_code = cond;
      }
    }

    for (auto& i : inst) {
      inst_sink.push_back(std::move(i));
    }
  }
  inst.clear();
  generate_return_and_cleanup();
  for (auto& i : inst) {
    inst_sink.push_back(std::move(i));
  }

  {
#pragma region passShow
    LOG(TRACE) << "VariableToReg: " << std::endl;
    for (auto& v : reg_map) {
      LOG(TRACE) << v.first << " -> ";
      display_reg_name(LOG(TRACE), v.second);
      LOG(TRACE) << std::endl;
    }
    LOG(TRACE) << std::endl;
#pragma endregion
  }

  {
    // Put variable to vreg map in extra data
    auto data =
        extra_data.find(optimization::MIR_VARIABLE_TO_ARM_VREG_DATA_NAME);
    if (data == extra_data.end()) {
      extra_data.insert({optimization::MIR_VARIABLE_TO_ARM_VREG_DATA_NAME,
                         optimization::MirVariableToArmVRegType()});
      data = extra_data.find(optimization::MIR_VARIABLE_TO_ARM_VREG_DATA_NAME);
    }
    auto& map =
        std::any_cast<optimization::MirVariableToArmVRegType&>(data->second);
    map.insert({func.name, std::move(this->reg_map)});
  }

  return arm::Function(func.name, func.type, std::move(inst_sink),
                       std::move(this->consts), stack_size);
}